

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O3

bool __thiscall
MeCab::DictionaryRewriter::rewrite
          (DictionaryRewriter *this,string *feature,string *ufeature,string *lfeature,
          string *rfeature)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  char *pcVar5;
  char **input;
  ostream *poVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char **ppcVar12;
  char *pcVar13;
  long lVar14;
  size_t size;
  die local_64;
  die local_63;
  undefined1 local_62;
  undefined1 local_61;
  char *local_60;
  char **local_58;
  DictionaryRewriter *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  local_50 = this;
  local_38 = ufeature;
  pcVar5 = (char *)operator_new__(0x2000);
  input = (char **)operator_new__(0x10000);
  if (0x1ffe < feature->_M_string_length) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"feature.size() < buf.size() - 1",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"too long feature",0x10);
    die::~die(&local_63);
  }
  local_40 = lfeature;
  strncpy(pcVar5,(feature->_M_dataplus)._M_p,0x1fff);
  sVar7 = strlen(pcVar5);
  if ((long)sVar7 < 1) {
    size = 0;
  }
  else {
    pcVar10 = pcVar5 + sVar7;
    pcVar13 = pcVar5;
    local_48 = rfeature;
    local_58 = input;
    local_60 = pcVar5;
    lVar3 = 0;
    ppcVar12 = input;
    uVar9 = 0x2000;
    do {
      for (; (lVar14 = lVar3, cVar2 = *pcVar13, cVar2 == '\t' || (cVar2 == ' '));
          pcVar13 = pcVar13 + 1) {
        lVar3 = lVar14;
      }
      if (cVar2 == '\"') {
        pcVar13 = pcVar13 + 1;
        pcVar11 = pcVar13;
        for (pcVar5 = pcVar13;
            (pcVar8 = pcVar5, pcVar5 < pcVar10 &&
            ((cVar2 = *pcVar5, cVar2 != '\"' ||
             (pcVar8 = pcVar5 + 1, pcVar1 = pcVar5 + 1, pcVar5 = pcVar8, *pcVar1 == '\"'))));
            pcVar5 = pcVar5 + 1) {
          *pcVar11 = cVar2;
          pcVar11 = pcVar11 + 1;
        }
        local_61 = 0x2c;
        pcVar8 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar8,pcVar10,&local_61);
      }
      else {
        local_62 = 0x2c;
        pcVar8 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar13,pcVar10,&local_62);
        pcVar11 = pcVar8;
      }
      input = local_58;
      pcVar5 = local_60;
      if (uVar9 < 2) {
        *ppcVar12 = pcVar13;
        if (uVar9 - 1 == 0) break;
      }
      else {
        *pcVar11 = '\0';
        *ppcVar12 = pcVar13;
      }
      ppcVar12 = ppcVar12 + 1;
      pcVar13 = pcVar8 + 1;
      lVar3 = lVar14 + 1;
      uVar9 = uVar9 - 1;
    } while (pcVar13 < pcVar10);
    size = lVar14 + 1;
    rfeature = local_48;
    if (0x1fff < size) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                 ,0x79);
      rfeature = local_48;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xab);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"n < col.size()",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"too long CSV entities",0x15);
      die::~die(&local_64);
    }
  }
  bVar4 = RewriteRules::rewrite(&local_50->unigram_rewrite_,size,input,local_38);
  if ((bVar4) &&
     (bVar4 = RewriteRules::rewrite(&local_50->left_rewrite_,size,input,local_40), bVar4)) {
    bVar4 = RewriteRules::rewrite(&local_50->right_rewrite_,size,input,rfeature);
  }
  else {
    bVar4 = false;
  }
  operator_delete__(input);
  operator_delete__(pcVar5);
  return bVar4;
}

Assistant:

bool DictionaryRewriter::rewrite(const std::string &feature,
                                 std::string *ufeature,
                                 std::string *lfeature,
                                 std::string *rfeature) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, BUF_SIZE> col;
  CHECK_DIE(feature.size() < buf.size() - 1) << "too long feature";
  std::strncpy(buf.get(), feature.c_str(), buf.size() - 1);
  const size_t n = tokenizeCSV(buf.get(), col.get(), col.size());
  CHECK_DIE(n < col.size()) << "too long CSV entities";
  return (unigram_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                   ufeature) &&
          left_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                lfeature) &&
          right_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                 rfeature));
}